

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int ParseEXRMultipartHeaderFromMemory
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,uchar *memory,
              char **err)

{
  char **ppcVar1;
  undefined8 uVar2;
  EXRHeader ***pppEVar3;
  undefined4 in_EAX;
  int iVar4;
  int iVar5;
  char *pcVar6;
  EXRHeader **ppEVar7;
  EXRHeader *exr_header;
  pointer paVar8;
  uchar *buf;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  bool empty_header;
  vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> infos;
  string err_str;
  bool local_115;
  int local_114;
  char **local_110;
  undefined1 local_108 [16];
  pointer local_f8;
  string local_e8;
  EXRHeader ***local_c8;
  int *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  int local_88 [4];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar12._0_4_ = -(uint)(exr_headers == (EXRHeader ***)0x0);
  auVar12._4_4_ = -(uint)(memory == (uchar *)0x0);
  auVar12._8_4_ = -(uint)(num_headers == (int *)0x0);
  auVar12._12_4_ = -(uint)(exr_version == (EXRVersion *)0x0);
  iVar4 = movmskps(in_EAX,auVar12);
  iVar5 = -3;
  if (iVar4 == 0) {
    buf = memory + 8;
    local_108 = (undefined1  [16])0x0;
    local_f8 = (pointer)0x0;
    local_110 = err;
    local_c8 = exr_headers;
    local_c0 = num_headers;
    do {
      local_48 = (undefined1  [16])0x0;
      local_58 = (undefined1  [16])0x0;
      local_68 = (undefined1  [16])0x0;
      local_78 = (undefined1  [16])0x0;
      local_88[0] = 0;
      local_88[1] = 0;
      local_88[2] = 0;
      local_88[3] = 0;
      local_98 = (undefined1  [16])0x0;
      local_a8 = (undefined1  [16])0x0;
      local_b8 = (undefined1  [16])0x0;
      local_e8._M_string_length = 0;
      local_e8.field_2._M_local_buf[0] = '\0';
      local_115 = false;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      iVar5 = tinyexr::ParseEXRHeader((HeaderInfo *)local_b8,&local_115,exr_version,&local_e8,buf);
      ppcVar1 = local_110;
      if (iVar5 == 0) {
        if (local_115 == true) {
          buf = buf + 1;
          iVar4 = 2;
        }
        else if (local_58._4_4_ == 0) {
          local_114 = -4;
          iVar4 = 1;
          if (local_110 != (char **)0x0) {
            *local_110 = "`chunkCount\' attribute is not found in the header.";
          }
        }
        else {
          std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::push_back
                    ((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> *)local_108,
                     (HeaderInfo *)local_b8);
          buf = buf + (uint)local_48._8_4_;
          iVar4 = 0;
        }
      }
      else {
        if (local_110 != (char **)0x0) {
          pcVar6 = strdup(local_e8._M_dataplus._M_p);
          *ppcVar1 = pcVar6;
        }
        iVar4 = 1;
        local_114 = iVar5;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,
                        CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                 local_e8.field_2._M_local_buf[0]) + 1);
      }
      if ((pointer)local_a8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
      }
      std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::~vector
                ((vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *)local_b8);
    } while (iVar4 == 0);
    iVar5 = local_114;
    if (iVar4 == 2) {
      paVar8 = (pointer)local_108._0_8_;
      uVar2 = local_108._8_8_;
      lVar10 = local_108._8_8_ - local_108._0_8_;
      ppEVar7 = (EXRHeader **)malloc(lVar10 >> 4);
      pppEVar3 = local_c8;
      *local_c8 = ppEVar7;
      if ((pointer)uVar2 == paVar8) {
        uVar11 = lVar10 >> 7;
      }
      else {
        lVar10 = 0;
        uVar9 = 0;
        do {
          exr_header = (EXRHeader *)malloc(0x10890);
          tinyexr::ConvertHeader
                    (exr_header,(HeaderInfo *)((long)paVar8->data_window + lVar10 + -0x30));
          exr_header->tiled = exr_version->tiled;
          (*pppEVar3)[uVar9] = exr_header;
          uVar9 = uVar9 + 1;
          uVar11 = (long)(local_108._8_8_ - local_108._0_8_) >> 7;
          lVar10 = lVar10 + 0x80;
          paVar8 = (pointer)local_108._0_8_;
        } while (uVar9 < uVar11);
      }
      *local_c0 = (int)uVar11;
      iVar5 = 0;
    }
    std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::~vector
              ((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> *)local_108);
  }
  return iVar5;
}

Assistant:

int ParseEXRMultipartHeaderFromMemory(EXRHeader ***exr_headers,
                                      int *num_headers,
                                      const EXRVersion *exr_version,
                                      const unsigned char *memory,
                                      const char **err) {
  if (memory == NULL || exr_headers == NULL || num_headers == NULL ||
      exr_version == NULL) {
    // Invalid argument
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  const char *buf = reinterpret_cast<const char *>(memory);

  const char *marker = &buf[4 + 4];  // skip magic number + version header

  std::vector<tinyexr::HeaderInfo> infos;

  for (;;) {
    tinyexr::HeaderInfo info;
    info.clear();

    std::string err_str;
    bool empty_header = false;
    int ret = ParseEXRHeader(&info, &empty_header, exr_version, &err_str,
                             reinterpret_cast<const unsigned char *>(marker));

    if (ret != TINYEXR_SUCCESS) {
      if (err) {
        (*err) = strdup(err_str.c_str());  // may leak
      }
      return ret;
    }

    if (empty_header) {
      marker += 1;  // skip '\0'
      break;
    }

    // `chunkCount` must exist in the header.
    if (info.chunk_count == 0) {
      if (err) {
        (*err) = "`chunkCount' attribute is not found in the header.";
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    infos.push_back(info);

    // move to next header.
    marker += info.header_len;
  }

  // allocate memory for EXRHeader and create array of EXRHeader pointers.
  (*exr_headers) =
      static_cast<EXRHeader **>(malloc(sizeof(EXRHeader *) * infos.size()));
  for (size_t i = 0; i < infos.size(); i++) {
    EXRHeader *exr_header = static_cast<EXRHeader *>(malloc(sizeof(EXRHeader)));

    ConvertHeader(exr_header, infos[i]);

    // transfoer `tiled` from version.
    exr_header->tiled = exr_version->tiled;

    (*exr_headers)[i] = exr_header;
  }

  (*num_headers) = static_cast<int>(infos.size());

  return TINYEXR_SUCCESS;
}